

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettingsTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionSettingsTests::TestreadFromIstream::TestreadFromIstream(TestreadFromIstream *this)

{
  char *suiteName;
  TestreadFromIstream *this_local;
  
  suiteName = SuiteSessionSettingsTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"readFromIstream",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionSettingsTestCase.cpp"
             ,0x24);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestreadFromIstream_00459b30;
  return;
}

Assistant:

TEST(readFromIstream)
{
  SessionSettings object;
  std::string configuration =
    "[DEFAULT]\n"
    "ConnectionType=initiator\n"
    "BeginString=FIX.4.0\n"
    "Value=4\n"
    "Empty=\n"
    "[SESSION]\n"
    "BeginString=FIX.4.2\n"
    "SenderCompID=ISLD\n"
    "TargetCompID=TW\n"
    "Value=1\n"
    "# this is a comment\n"
    "[SESSION]\n"
    "BeginString=FIX.4.1\n"
    "SenderCompID=ISLD\n"
    "TargetCompID=WT\n"
    "Value=2\n"
    "[SESSION]\n"
    "SenderCompID=ARCA\n"
    "TargetCompID=TW\n"
    "Value=3\n"
    "[SESSION]\n"
    "SenderCompID=ARCA\n"
    "TargetCompID=WT\n"
    "[SESSION]\n"
    "SenderCompID=NYSE\n"
    "TargetCompID=TW\n"
    "SessionQualifier=QUAL1\n"
    "Value=5\n"
    "[SESSION]\n"
    "SenderCompID=NYSE\n"
    "TargetCompID=TW\n"
    "SessionQualifier=QUAL2\n"
    "Value=6\n"
    "[SESSION]\n"
    "BeginString=FIXT.1.1\n"
    "SenderCompID=NYSE\n"
    "TargetCompID=TW\n";

  std::istringstream input( configuration );

  input >> object;

  SessionID session1( BeginString( "FIX.4.2" ),
                      SenderCompID( "ISLD" ),
                      TargetCompID( "TW" ) );
  SessionID session2( BeginString( "FIX.4.1" ),
                      SenderCompID( "ISLD" ),
                      TargetCompID( "WT" ) );
  SessionID session3( BeginString( "FIX.4.0" ),
                      SenderCompID( "ARCA" ),
                      TargetCompID( "TW" ) );
  SessionID session4( BeginString( "FIX.4.0" ),
                      SenderCompID( "ARCA" ),
                      TargetCompID( "WT" ) );
  SessionID session5( BeginString( "FIX.4.0" ),
                      SenderCompID( "NYSE" ),
                      TargetCompID( "TW" ),
                      "QUAL1" );
  SessionID session6( BeginString( "FIX.4.0" ),
                      SenderCompID( "NYSE" ),
                      TargetCompID( "TW" ),
                      "QUAL2" );

  CHECK_EQUAL( "", object.get().getString( "Empty" ) );

  CHECK_EQUAL( 4, object.get().getInt( "Value" ) );
  CHECK_EQUAL( 1, object.get( session1 ).getInt( "Value" ) );
  CHECK_EQUAL( 2, object.get( session2 ).getInt( "Value" ) );
  CHECK_EQUAL( 3, object.get( session3 ).getInt( "Value" ) );
  CHECK_EQUAL( 4, object.get( session4 ).getInt( "Value" ) );
  CHECK_EQUAL( 5, object.get( session5 ).getInt( "Value" ) );
  CHECK_EQUAL( 6, object.get( session6 ).getInt( "Value" ) );

  // case insensitivity
  CHECK_EQUAL( 4, object.get().getInt( "value" ) );
  CHECK_EQUAL( 1, object.get( session1 ).getInt( "value" ) );
  CHECK_EQUAL( 2, object.get( session2 ).getInt( "value" ) );
  CHECK_EQUAL( 3, object.get( session3 ).getInt( "value" ) );
  CHECK_EQUAL( 4, object.get( session4 ).getInt( "value" ) );
  CHECK_EQUAL( 5, object.get( session5 ).getInt( "value" ) );
  CHECK_EQUAL( 6, object.get( session6 ).getInt( "value" ) );

  CHECK_EQUAL( 4, object.get().getInt( "VALUE" ) );
  CHECK_EQUAL( 1, object.get( session1 ).getInt( "VALUE" ) );
  CHECK_EQUAL( 2, object.get( session2 ).getInt( "VALUE" ) );
  CHECK_EQUAL( 3, object.get( session3 ).getInt( "VALUE" ) );
  CHECK_EQUAL( 4, object.get( session4 ).getInt( "VALUE" ) );
  CHECK_EQUAL( 5, object.get( session5 ).getInt( "VALUE" ) );
  CHECK_EQUAL( 6, object.get( session6 ).getInt( "VALUE" ) );
}